

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

optional<std::shared_ptr<BlockStatementAstNode>_> * __thiscall
Parser::parseBlockStatement
          (optional<std::shared_ptr<BlockStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  undefined1 *puVar1;
  int iVar2;
  undefined8 uVar3;
  char cVar4;
  char cVar5;
  TokenType type;
  undefined1 local_b8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  shared_ptr<Token> identifier;
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  statements;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  size_type __dnew_1;
  optional<std::shared_ptr<StatementAstNode>_> statement;
  char local_31;
  bool error;
  
  local_31 = '\0';
  puVar1 = (undefined1 *)
           ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8);
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1d;
  __dnew_1 = (size_type)puVar1;
  __dnew_1 = std::__cxx11::string::_M_create
                       (&__dnew_1,
                        (ulong)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  builtin_strncpy((char *)__dnew_1,"Expected a left curly bracket",0x1d);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(char *)(__dnew_1 +
           (long)identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
       = '\0';
  type = (TokenType)this;
  expect((Parser *)&stack0xffffffffffffff68,type,(bool *)0x2,(string *)&local_31);
  if ((undefined1 *)__dnew_1 != puVar1) {
    operator_delete((void *)__dnew_1,
                    (long)statement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_payload._M_value.
                          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
  }
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar5 = local_31;
  while( true ) {
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)&__dnew_1);
    iVar2 = *(int *)(__dnew_1 + 0x20);
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar2 == 1) {
      puVar1 = (undefined1 *)
               ((long)&statement.
                       super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                       .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload
               + 8);
      local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2d;
      __dnew_1 = (size_type)puVar1;
      local_31 = cVar5;
      __dnew_1 = std::__cxx11::string::_M_create(&__dnew_1,(ulong)&local_60);
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_60._M_pi;
      builtin_strncpy((char *)__dnew_1,"Expected a right curly bracket to close block",0x2d);
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_60._M_pi;
      *(char *)(__dnew_1 + (long)local_60._M_pi) = '\0';
      expect((Parser *)local_b8,type,(bool *)0x3,(string *)&local_31);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      if ((undefined1 *)__dnew_1 != puVar1) {
        operator_delete((void *)__dnew_1,
                        (long)statement.
                              super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                              .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                              _M_payload._M_value.
                              super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 1);
      }
      goto LAB_0010ae68;
    }
    TokenBuffer::currentToken((TokenBuffer *)&__dnew_1);
    iVar2 = *(int *)(__dnew_1 + 0x20);
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar2 == 3) break;
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)&__dnew_1,this);
    cVar4 = '\x01';
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\x01')
    {
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::push_back((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                   *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  (value_type *)&__dnew_1);
      cVar4 = cVar5;
    }
    cVar5 = cVar4;
    if ((statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
         super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\x01'
        ) && (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
              super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (__shared_count<(__gnu_cxx::_Lock_policy)2>)
                   ((ulong)statement.
                           super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                           _M_payload.
                           super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                           .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                           _M_payload._M_value.
                           super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi & 0xffffffffffffff00),
             statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
             super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  puVar1 = (undefined1 *)
           ((long)&statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload + 8);
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2d;
  __dnew_1 = (size_type)puVar1;
  local_31 = cVar5;
  __dnew_1 = std::__cxx11::string::_M_create(&__dnew_1,(ulong)&local_60);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_60._M_pi;
  builtin_strncpy((char *)__dnew_1,"Expected a right curly bracket to close block",0x2d);
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_60._M_pi;
  *(char *)(__dnew_1 + (long)local_60._M_pi) = '\0';
  expect((Parser *)(local_b8 + 0x10),type,(bool *)0x3,(string *)&local_31);
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if ((undefined1 *)__dnew_1 != puVar1) {
    operator_delete((void *)__dnew_1,
                    (long)statement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_payload._M_value.
                          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
  }
  if (local_31 == '\0') {
    __dnew_1 = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<BlockStatementAstNode,std::allocator<BlockStatementAstNode>,std::vector<std::shared_ptr<StatementAstNode>,std::allocator<std::shared_ptr<StatementAstNode>>>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement,
               (BlockStatementAstNode **)&__dnew_1,(allocator<BlockStatementAstNode> *)&local_60,
               (vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    uVar3 = statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
            super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BlockStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BlockStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<BlockStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)__dnew_1;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BlockStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BlockStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<BlockStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BlockStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BlockStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<BlockStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    __dnew_1 = 0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BlockStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BlockStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>._M_engaged = true;
  }
  else {
LAB_0010ae68:
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BlockStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BlockStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>._M_engaged = false;
  }
  std::
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>::
  ~vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<BlockStatementAstNode>>
Parser::parseBlockStatement() noexcept {
  bool error = false;

  auto identifier = this->expect(TokenType::LeftCurly, error, "Expected a left curly bracket");

  std::vector<std::shared_ptr<StatementAstNode>> statements;

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightCurly, error, "Expected a right curly bracket to close block");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error, "Expected a right curly bracket to close block");
      break;
    }

    auto statement = this->parseStatement();

    if (!statement) {
      error = true;

    } else {
      statements.push_back(statement.value());
    }
  }

  if (error) { return std::nullopt; }

  return std::make_shared<BlockStatementAstNode>(statements);
}